

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Readable.cpp
# Opt level: O0

vector<std::byte,_std::allocator<std::byte>_> *
Cup::Properties::Readable::readBinary
          (vector<std::byte,_std::allocator<std::byte>_> *__return_storage_ptr__,
          string_view filename)

{
  size_type __n;
  bool bVar1;
  byte bVar2;
  byte *pbVar3;
  runtime_error *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  undefined1 local_318 [8];
  string message;
  string pathAbsolute;
  undefined1 local_2d0 [16];
  size_type local_2c0;
  size_t sizeFile;
  ifstream inputStream;
  undefined1 local_b0 [8];
  directory_entry file;
  path local_70;
  undefined1 local_48 [8];
  path path;
  string_view filename_local;
  vector<std::byte,_std::allocator<std::byte>_> *buffer;
  
  path._32_8_ = filename._M_len;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_70,(basic_string_view<char,_std::char_traits<char>_> *)&path._M_cmpts,
             auto_format);
  std::filesystem::absolute((path *)local_48);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::directory_entry::directory_entry
            ((directory_entry *)local_b0,(path *)local_48);
  bVar1 = std::filesystem::__cxx11::directory_entry::exists((directory_entry *)local_b0);
  if ((!bVar1) ||
     (bVar1 = std::filesystem::__cxx11::directory_entry::is_regular_file
                        ((directory_entry *)local_b0), !bVar1)) {
    std::filesystem::__cxx11::path::operator_cast_to_string
              ((string_type *)((long)&message.field_2 + 8),(path *)local_48);
    s_abi_cxx11_(&local_398,"The file with path <",0x14);
    std::operator+(&local_378,&local_398,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&message.field_2 + 8));
    s_abi_cxx11_(&local_3b8,"> not exist, not is a regular file",0x22);
    std::operator+(&local_358,&local_378,&local_3b8);
    s_abi_cxx11_(&local_3d8," or the path is wrong.\nPlease assure that path is",0x31);
    std::operator+(&local_338,&local_358,&local_3d8);
    s_abi_cxx11_(&local_3f8," valid and the file not is a directory.",0x27);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                   &local_338,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_398);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,(string *)local_318);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ifstream *)&sizeFile,(path *)local_48,_S_bin);
  bVar2 = std::ifstream::is_open();
  pathAbsolute.field_2._M_local_buf[8] = (bVar2 & 1) != 0;
  if ((bool)pathAbsolute.field_2._M_local_buf[8]) {
    std::istream::seekg((long)&sizeFile,_S_beg);
    local_2d0 = std::istream::tellg();
    local_2c0 = std::fpos::operator_cast_to_long((fpos *)local_2d0);
    std::istream::seekg((long)&sizeFile,_S_beg);
    __n = local_2c0;
    pathAbsolute.field_2._M_local_buf[0xf] = '\0';
    std::allocator<std::byte>::allocator
              ((allocator<std::byte> *)(pathAbsolute.field_2._M_local_buf + 0xe));
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (__return_storage_ptr__,__n,
               (allocator<std::byte> *)(pathAbsolute.field_2._M_local_buf + 0xe));
    std::allocator<std::byte>::~allocator
              ((allocator<std::byte> *)(pathAbsolute.field_2._M_local_buf + 0xe));
    pbVar3 = std::vector<std::byte,_std::allocator<std::byte>_>::data(__return_storage_ptr__);
    std::istream::read((char *)&sizeFile,(long)pbVar3);
    pathAbsolute.field_2._M_local_buf[0xf] = '\x01';
  }
  pathAbsolute.field_2._9_3_ = 0;
  std::ifstream::~ifstream(&sizeFile);
  if (pathAbsolute.field_2._8_4_ == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"An unexpected error has occurred, this exception should not be thrown");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::filesystem::__cxx11::directory_entry::~directory_entry((directory_entry *)local_b0);
  std::filesystem::__cxx11::path::~path((path *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::byte> Properties::Readable::readBinary(std::string_view filename)
{
	// Get the absolute path to file, is more simple
	// inform of error with the absolute path.
	const fs::path path(fs::absolute(filename));
	// Verify that the file exist and that it is regular file
	const fs::directory_entry file(path);

	if (file.exists() and file.is_regular_file())
	{
		// Open the file in mode only read and read of binary
		std::ifstream inputStream(path, std::ios::binary);

		// Checks if the stream has an associated file
		if (inputStream.is_open())
		{
			// You can imagine ifstream as a position,
			// and that position has the ability to
			// move through the file, you can move
			// anywhere within the file and read content
			// from that position.
			// What we want to do is determine the
			// size of the file to read it completely
			// in a single iteration, so our position
			// needs to move to the end of the file,
			// and then ask him where he is.
			inputStream.seekg(0, std::ifstream::end);
			// This is how we ask our position where it is
			const std::size_t sizeFile = inputStream.tellg();
			// To read the entire contents of the file,
			// it is necessary to move back to the beginning
			// of the file
			inputStream.seekg(0, std::ifstream::beg);

			// std::byte was introduced in C++17, allowing
			// interpret unsigned char and char as a byte

			// See the motivations of use std::byte instead
			// of unsigned char and char

			// 		Many programs require byte-oriented access
			// 		to memory. Today, such programs must use
			// 		either the char, signed char, or unsigned
			// 		char types for this purpose. However, these
			// 		types perform a “triple duty”. Not only are
			// 		they used for byte addressing, but also as
			// 		arithmetic types, and as character types.
			// 		This multiplicity of roles opens the door
			// 		for programmer error – such as accidentally
			// 		performing arithmetic on memory that should
			// 		be treated as a byte value – and confusion
			// 		for both programmers and tools.
			// Ref: http://open-std.org/JTC1/SC22/WG21/docs/papers/2016/p0298r0.pdf
			std::vector<std::byte> buffer(sizeFile);

			// The "reinterpret_cast<char*>" is necessary,
			// yet that the method read not support to read
			// of std::byte type, only of pointers (aka: arrays)
			// of type char
			inputStream.read(reinterpret_cast<char*>(buffer.data()), sizeFile);

			return buffer;
		}
	}
	else
	{
		// For create std::string in compilation
		// time is necessary say to compile that the
		// string literal [aka: const char*] will
		// be convert to std::string; note the 's'
		// added to end of string literals.
		using namespace std::string_literals;

		const std::string pathAbsolute = path;
		const std::string message = "The file with path <"s
				+ pathAbsolute + "> not exist, not is a regular file"s
				+ " or the path is wrong.\nPlease assure that path is"s
				+ " valid and the file not is a directory."s;

		throw std::runtime_error(message);
	}

	throw std::runtime_error("An unexpected error has occurred,"
						  " this exception should not be thrown");
}